

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

void __thiscall ui::Led::TriggerTimer(Led *this)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  string local_238;
  ostream local_218 [512];
  
  __lhs = &this->file_path_;
  std::operator+(&bStack_258,__lhs,"/trigger");
  std::ofstream::ofstream(local_218,(string *)&bStack_258,_S_out);
  std::operator<<(local_218,"timer");
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::operator+(&bStack_258,__lhs,"/delay_on");
  std::ofstream::ofstream(local_218,(string *)&bStack_258,_S_out);
  std::__cxx11::to_string(&local_238,(int)((float)this->period_ * this->ratio_));
  std::operator<<(local_218,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::operator+(&bStack_258,__lhs,"/delay_off");
  std::ofstream::ofstream(local_218,(string *)&bStack_258,_S_out);
  std::__cxx11::to_string(&local_238,(int)((float)this->period_ * (1.0 - this->ratio_)));
  std::operator<<(local_218,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::~string((string *)&bStack_258);
  FetchState(this);
  return;
}

Assistant:

void TriggerTimer() {
    std::ofstream(file_path_ + "/trigger") << "timer";
    std::ofstream(file_path_ + "/delay_on")
        << std::to_string(int(ratio_ * period_));
    std::ofstream(file_path_ + "/delay_off")
        << std::to_string(int((1.f - ratio_) * period_));
    FetchState();
  }